

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack14_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar11 [32];
  
  auVar8 = *(undefined1 (*) [16])in;
  auVar9._8_8_ = *(undefined8 *)(in + 2);
  auVar9._0_8_ = *(undefined8 *)(in + 2);
  uVar1 = in[1];
  auVar9 = vpsllvd_avx2(auVar9,_DAT_0019b790);
  auVar7._8_8_ = 0x300000003f00;
  auVar7._0_8_ = 0x300000003f00;
  auVar7 = vpandq_avx512vl(auVar9,auVar7);
  *out = *in & 0x3fff;
  uVar2 = in[6];
  auVar14 = vpermq_avx2(ZEXT1632(auVar8),0xd8);
  auVar14 = vpshufd_avx2(auVar14,0x50);
  auVar5 = vpsrlvd_avx2(auVar14,_DAT_00196380);
  auVar10._8_4_ = 0x3fff;
  auVar10._0_8_ = 0x3fff00003fff;
  auVar10._12_4_ = 0x3fff;
  auVar11._16_4_ = 0x3fff;
  auVar11._0_16_ = auVar10;
  auVar11._20_4_ = 0x3fff;
  auVar11._24_4_ = 0x3fff;
  auVar11._28_4_ = 0x3fff;
  auVar9 = vpinsrd_avx(auVar10,(uVar1 & 0x3ff) << 4,1);
  uVar3 = *(ulong *)(in + 4);
  auVar14._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar9;
  auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  auVar14 = vshufps_avx(auVar14,ZEXT1632(auVar7),0x24);
  auVar11 = vpand_avx2(auVar5,auVar11);
  auVar14 = vpor_avx2(auVar5,auVar14);
  auVar14 = vpblendd_avx2(auVar11,auVar14,0x2a);
  auVar9 = vpmovsxbd_avx(ZEXT416(0x1000007));
  *(undefined1 (*) [32])(out + 1) = auVar14;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar7 = vpsllvd_avx2(auVar12,_DAT_0019b860);
  auVar4._8_8_ = 0x3fc000003ffc;
  auVar4._0_8_ = 0x3fc000003ffc;
  auVar7 = vpandq_avx512vl(auVar7,auVar4);
  auVar8 = vpermi2d_avx512vl(auVar9,auVar12,auVar8);
  auVar4 = vpsrlvd_avx2(auVar8,_DAT_00199650);
  auVar9 = vpmovsxbd_avx(ZEXT416(0x1000004));
  auVar8 = vpmovzxdq_avx(auVar7);
  auVar7 = vpor_avx(auVar4,auVar8);
  auVar8 = vpand_avx(auVar4,auVar10);
  auVar8 = vpblendd_avx2(auVar7,auVar8,10);
  *(undefined1 (*) [16])(out + 9) = auVar8;
  out[0xd] = (uint)(uVar3 >> 0x36) | (uVar2 & 0xf) << 10;
  out[0xe] = uVar2 >> 4 & 0x3fff;
  uVar1 = in[7];
  out[0xf] = uVar2 >> 0x12;
  out[0x10] = uVar1 & 0x3fff;
  uVar3 = *(ulong *)(in + 8);
  out[0x11] = uVar1 >> 0xe & 0x3fff;
  uVar2 = in[10];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar3;
  auVar8 = vpsllvd_avx2(auVar13,_DAT_0019be10);
  auVar6._8_8_ = 0x3f0000003ff0;
  auVar6._0_8_ = 0x3f0000003ff0;
  auVar8 = vpandq_avx512vl(auVar8,auVar6);
  auVar9 = vpermi2d_avx512vl(auVar9,auVar13,ZEXT416(uVar1));
  auVar7 = vpsrlvd_avx2(auVar9,_DAT_001a6240);
  auVar9 = vpmovzxdq_avx(auVar8);
  auVar8 = vpand_avx(auVar7,auVar10);
  auVar9 = vpor_avx(auVar7,auVar9);
  auVar8 = vpblendd_avx2(auVar9,auVar8,10);
  *(undefined1 (*) [16])(out + 0x12) = auVar8;
  out[0x16] = (uint)(uVar3 >> 0x34) | (uVar2 & 3) << 0xc;
  out[0x17] = uVar2 >> 2 & 0x3fff;
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack14_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;
  *out = ((*in) >> 16) % (1U << 14);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 12)) << (14 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 14);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 8)) << (14 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 14);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 4)) << (14 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 14);
  out++;
  *out = ((*in) >> 18);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;

  return in + 1;
}